

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modified.cpp
# Opt level: O0

void __thiscall
alternative::alternative
          (alternative *this,int add,vector<int,_std::allocator<int>_> *_removed,
          vector<int,_std::allocator<int>_> *_vs,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *newAdj,branch_and_reduce_algorithm *_pAlg,int k)

{
  bool bVar1;
  vector<int,_std::allocator<int>_> *pvVar2;
  reference piVar3;
  reference this_00;
  size_type sVar4;
  vector<int,std::allocator<int>> *this_01;
  iterator iStack_70;
  int vv;
  iterator __end4;
  iterator __begin4;
  vector<int,_std::allocator<int>_> *__range4;
  iterator iStack_50;
  int v;
  iterator __end2;
  iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  branch_and_reduce_algorithm *_pAlg_local;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *newAdj_local;
  vector<int,_std::allocator<int>_> *_vs_local;
  vector<int,_std::allocator<int>_> *_removed_local;
  int add_local;
  alternative *this_local;
  
  modified::modified(&this->super_modified,add,_removed,_vs,newAdj,_pAlg);
  (this->super_modified)._vptr_modified = (_func_int **)&PTR__alternative_00164c40;
  *(int *)&(this->super_modified).field_0x64 = k;
  if ((branch_and_reduce_algorithm::USE_DEPENDENCY_CHECKING & 1U) != 0) {
    (this->super_modified).foldingMapAdd = 0;
    pvVar2 = &(this->super_modified).removed;
    __end2 = std::vector<int,_std::allocator<int>_>::begin(pvVar2);
    iStack_50 = std::vector<int,_std::allocator<int>_>::end(pvVar2);
    while (bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffb0), bVar1) {
      piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end2);
      __range4._4_4_ = *piVar3;
      this_00 = std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::operator[](&((this->super_modified).pAlg)->packingMap,(long)__range4._4_4_);
      sVar4 = std::vector<int,_std::allocator<int>_>::size(this_00);
      if (sVar4 != 0) {
        (this->super_modified).foldingMapAdd = (this->super_modified).foldingMapAdd + 1;
        pvVar2 = &(this->super_modified).vs;
        __end4 = std::vector<int,_std::allocator<int>_>::begin(pvVar2);
        iStack_70 = std::vector<int,_std::allocator<int>_>::end(pvVar2);
        while (bVar1 = __gnu_cxx::operator!=(&__end4,&stack0xffffffffffffff90), bVar1) {
          piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&__end4);
          this_01 = (vector<int,std::allocator<int>> *)
                    std::
                    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ::operator[](&((this->super_modified).pAlg)->foldingMap,(long)*piVar3);
          std::vector<int,std::allocator<int>>::emplace_back<int&>
                    (this_01,(int *)((long)&__range4 + 4));
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&__end4);
        }
      }
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end2);
    }
  }
  return;
}

Assistant:

alternative::alternative(int const add, std::vector<int> &_removed, std::vector<int> &_vs, std::vector<std::vector<int>> &newAdj, branch_and_reduce_algorithm *_pAlg, int k)
    : modified(add, _removed, _vs, newAdj, _pAlg)
    {
        this->k = k;

        if (pAlg->USE_DEPENDENCY_CHECKING) {
            foldingMapAdd = 0;

            for (int v : removed) {
                if (pAlg->packingMap[v].size() != 0) {
                    foldingMapAdd += 1;
                    for (int vv : vs) {
                        pAlg->foldingMap[vv].emplace_back(v);
                    }
                }
            }        
        }
    }